

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O3

void __thiscall
RenX_LoggingPlugin::RenX_OnVoteRestartMap
          (RenX_LoggingPlugin *this,Server *server,TeamType *team,PlayerInfo *player)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  code *pcVar4;
  undefined1 auVar5 [16];
  string msg;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if ((this->field_0xa8 & 1) == 0) {
    pcVar4 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar4 = RenX::Server::sendLogChan;
  }
  local_50 = local_40;
  pcVar1 = (this->voteRestartMapFmt)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->voteRestartMapFmt)._M_string_length);
  if (local_48 != 0) {
    RenX::processTags((string *)&local_50,server,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa08);
    uVar3 = *(undefined8 *)(RenX::tags + 0xa10);
    auVar5 = RenX::getTeamColor(*team);
    RenX::replace_tag(&local_50,uVar3,uVar2,auVar5._0_8_,auVar5._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa28);
    uVar3 = *(undefined8 *)(RenX::tags + 0xa30);
    auVar5 = RenX::getTeamName(*team);
    RenX::replace_tag(&local_50,uVar3,uVar2,auVar5._0_8_,auVar5._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa48);
    uVar3 = *(undefined8 *)(RenX::tags + 0xa50);
    auVar5 = RenX::getFullTeamName(*team);
    RenX::replace_tag(&local_50,uVar3,uVar2,auVar5._0_8_,auVar5._8_8_);
    (*pcVar4)(server,local_48,local_50);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnVoteRestartMap(RenX::Server &server, const RenX::TeamType &team, const RenX::PlayerInfo &player)
{
	logFuncType func;
	if (RenX_LoggingPlugin::voteCallPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->voteRestartMapFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(team));
		(server.*func)(msg);
	}
}